

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O0

void __thiscall
Graph<Node>::printShortestPath(Graph<Node> *this,ofstream *fout,int *node1,int *node2)

{
  ostream *poVar1;
  vector<int> *pvVar2;
  int *piVar3;
  int local_2c;
  int *piStack_28;
  int currNode;
  int *node2_local;
  int *node1_local;
  ofstream *fout_local;
  Graph<Node> *this_local;
  
  piStack_28 = node2;
  node2_local = node1;
  node1_local = (int *)fout;
  fout_local = (ofstream *)this;
  poVar1 = std::operator<<((ostream *)fout,"Shortest path between ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*node2_local);
  poVar1 = std::operator<<(poVar1," and ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*piStack_28);
  std::operator<<(poVar1,":\n\n");
  pvVar2 = vector<vector<int>_>::operator[](&this->minDist,node2_local);
  piVar3 = vector<int>::operator[](pvVar2,piStack_28);
  if (*piVar3 == -1) {
    std::operator<<((ostream *)node1_local,"DOES NOT EXIST");
    std::operator<<((ostream *)node1_local,"\n------------------------\n\n");
  }
  else {
    local_2c = *node2_local;
    while (local_2c != *piStack_28) {
      poVar1 = (ostream *)std::ostream::operator<<(node1_local,local_2c);
      std::operator<<(poVar1,' ');
      pvVar2 = vector<vector<int>_>::operator[](&this->nextNodeInPath,&local_2c);
      piVar3 = vector<int>::operator[](pvVar2,piStack_28);
      local_2c = *piVar3;
    }
    poVar1 = (ostream *)std::ostream::operator<<(node1_local,*piStack_28);
    std::operator<<(poVar1,"\n------------------------\n\n");
  }
  return;
}

Assistant:

void printShortestPath(std::ofstream &fout, const int &node1, const int &node2) {
        fout << "Shortest path between " << node1 << " and " << node2 << ":\n\n";
        if (minDist[node1][node2] == -1) {
            fout << "DOES NOT EXIST";
            fout << "\n------------------------\n\n";
            return;
        }

        int currNode = node1;
        while (currNode != node2) {
            fout << currNode << ' ';
            currNode = nextNodeInPath[currNode][node2];
        }

        fout << node2 << "\n------------------------\n\n";
    }